

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::JavascriptArray::SliceHelper<void*>
               (JavascriptArray *pArr,JavascriptArray *pnewArr,uint32 start,uint32 newLen)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ScriptContext *this;
  ThreadContext *threadContext;
  SparseArraySegmentBase **ppSVar6;
  undefined4 *puVar7;
  SparseArraySegmentBase *pSVar8;
  uint local_78;
  uint32 i_1;
  BOOL gotItem;
  Var element;
  SparseArraySegmentBase *pSStack_60;
  uint32 i;
  SparseArraySegment<void_*> *pnewHeadSeg;
  SparseArraySegment<void_*> *headSeg;
  undefined1 local_40 [8];
  JsReentLock jsReentLock;
  uint32 newLen_local;
  uint32 start_local;
  JavascriptArray *pnewArr_local;
  JavascriptArray *pArr_local;
  
  jsReentLock._24_4_ = newLen;
  jsReentLock._28_4_ = start;
  this = RecyclableObject::GetScriptContext((RecyclableObject *)pArr);
  threadContext = ScriptContext::GetThreadContext(this);
  JsReentLock::JsReentLock((JsReentLock *)local_40,threadContext);
  JsReentLock::setObjectForMutation((JsReentLock *)local_40,pArr);
  ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                      ((WriteBarrierPtr *)&pArr->head);
  pnewHeadSeg = SparseArraySegment<void_*>::From(*ppSVar6);
  ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                      ((WriteBarrierPtr *)&pnewArr->head);
  pSStack_60 = &SparseArraySegment<void_*>::From(*ppSVar6)->super_SparseArraySegmentBase;
  Memory::CopyArray<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>,Memory::Recycler>
            ((WriteBarrierPtr<void> *)(pSStack_60 + 1),(ulong)(uint)jsReentLock._24_4_,
             (WriteBarrierPtr<void> *)
             (&pnewHeadSeg[1].super_SparseArraySegmentBase.left +
             (ulong)(uint)jsReentLock._28_4_ * 2),(ulong)(uint)jsReentLock._24_4_);
  pSStack_60->length = jsReentLock._24_4_;
  SparseArraySegmentBase::CheckLengthvsSize(pSStack_60);
  if (pSStack_60->size < pSStack_60->length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x185e,"(pnewHeadSeg->length <= pnewHeadSeg->size)",
                                "pnewHeadSeg->length <= pnewHeadSeg->size");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar3 = HasNoMissingValues(pArr);
  if (bVar3) {
    for (local_78 = 0; local_78 < (uint)jsReentLock._24_4_; local_78 = local_78 + 1) {
      bVar3 = SparseArraySegment<void_*>::IsMissingItem<void>
                        ((WriteBarrierPtr<void> *)
                         (&pnewHeadSeg[1].super_SparseArraySegmentBase.left +
                         (ulong)(local_78 + jsReentLock._28_4_) * 2));
      if (bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x187c,
                                    "(!SparseArraySegment<T>::IsMissingItem(&headSeg->elements[i+start]))"
                                    ,"Array marked incorrectly as having missing value");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
    }
  }
  else {
    element._4_4_ = 0;
    while ((element._4_4_ < (uint)jsReentLock._24_4_ &&
           (pSVar8 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pArr->head),
           pSVar8->left <= element._4_4_ + jsReentLock._28_4_))) {
      uVar4 = element._4_4_ + jsReentLock._28_4_;
      pSVar8 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pArr->head);
      TVar1 = pSVar8->left;
      pSVar8 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pArr->head);
      if (TVar1 + pSVar8->length <= uVar4) break;
      bVar3 = IsMissingItem(pArr,element._4_4_ + jsReentLock._28_4_);
      if (bVar3) {
        SetHasNoMissingValues(pnewArr,false);
        JsReentLock::unlock((JsReentLock *)local_40);
        iVar5 = (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x71])(pArr,(ulong)(element._4_4_ + jsReentLock._28_4_),&i_1);
        JsReentLock::MutateArrayObject((JsReentLock *)local_40);
        JsReentLock::relock((JsReentLock *)local_40);
        if (iVar5 != 0) {
          JsReentLock::unlock((JsReentLock *)local_40);
          (*(pnewArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                    (pnewArr,(ulong)element._4_4_,_i_1,0);
          JsReentLock::MutateArrayObject((JsReentLock *)local_40);
          JsReentLock::relock((JsReentLock *)local_40);
        }
      }
      element._4_4_ = element._4_4_ + 1;
    }
  }
  JsReentLock::~JsReentLock((JsReentLock *)local_40);
  return;
}

Assistant:

void JavascriptArray::SliceHelper(JavascriptArray* pArr,  JavascriptArray* pnewArr, uint32 start, uint32 newLen)
    {
        JS_REENTRANCY_LOCK(jsReentLock, pArr->GetScriptContext()->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        SparseArraySegment<T>* headSeg = SparseArraySegment<T>::From(pArr->head);
        SparseArraySegment<T>* pnewHeadSeg = SparseArraySegment<T>::From(pnewArr->head);

        // Fill the newly created sliced array
        CopyArray(pnewHeadSeg->elements, newLen, headSeg->elements + start, newLen);
        pnewHeadSeg->length = newLen;
        pnewHeadSeg->CheckLengthvsSize();

        Assert(pnewHeadSeg->length <= pnewHeadSeg->size);
        // Prototype lookup for missing elements
        if (!pArr->HasNoMissingValues())
        {
            for (uint32 i = 0; i < newLen; i++)
            {
                if (!(pArr->head->left <= (i + start) && (i + start) <  (pArr->head->left + pArr->head->length)))
                {
                    break;
                }

                // array type might be changed in the below call to DirectGetItemAtFull
                // need recheck array type before checking array item [i + start]
                if (pArr->IsMissingItem(i + start))
                {
                    Var element;
                    pnewArr->SetHasNoMissingValues(false);
                    JS_REENTRANT(jsReentLock, BOOL gotItem = pArr->DirectGetItemAtFull(i + start, &element));
                    if (gotItem)
                    {
                        JS_REENTRANT(jsReentLock, pnewArr->SetItem(i, element, PropertyOperation_None));
                    }
                }
            }
        }
#ifdef DBG
        else
        {
            for (uint32 i = 0; i < newLen; i++)
            {
                AssertMsg(!SparseArraySegment<T>::IsMissingItem(&headSeg->elements[i+start]), "Array marked incorrectly as having missing value");
            }
        }
#endif
    }

    // If the creating profile data has changed, convert it to the type of array indicated
    // in the profile
    void JavascriptArray::GetArrayTypeAndConvert(bool* isIntArray, bool* isFloatArray)
    {
        JavascriptNativeIntArray* nativeIntArray = JavascriptOperators::TryFromVar<JavascriptNativeIntArray>(this);
        if (nativeIntArray)
        {
#if ENABLE_PROFILE_INFO
            ArrayCallSiteInfo* info = nativeIntArray->GetArrayCallSiteInfo();
            if(!info || info->IsNativeIntArray())
            {
                *isIntArray = true;
            }
            else if(info->IsNativeFloatArray())
            {
                JavascriptNativeIntArray::ToNativeFloatArray(nativeIntArray);
                *isFloatArray = true;
            }
            else
            {
                JavascriptNativeIntArray::ToVarArray(nativeIntArray);
            }
#else
            *isIntArray = true;
#endif
        }
        else
        {
            JavascriptNativeFloatArray* nativeFloatArray = JavascriptOperators::TryFromVar<JavascriptNativeFloatArray>(this);
            if (nativeFloatArray)
            {
#if ENABLE_PROFILE_INFO
                ArrayCallSiteInfo* info = nativeFloatArray->GetArrayCallSiteInfo();

                if (info && !info->IsNativeArray())
                {
                    JavascriptNativeFloatArray::ToVarArray(nativeFloatArray);
                }
                else
                {
                    *isFloatArray = true;
                }
#else
                *isFloatArray = true;
#endif
            }
        }
    }

    Var JavascriptArray::EntrySlice(RecyclableObject* function, CallInfo callInfo, ...)
    {
        JIT_HELPER_REENTRANT_HEADER(Array_Slice);
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        Assert(!(callInfo.Flags & CallFlags_New));

        Var res = scriptContext->GetLibrary()->GetUndefined();

        if (args.Info.Count == 0)
        {
            return res;
        }

        BigIndex length;
        JavascriptArray* pArr = nullptr;
        RecyclableObject* obj = nullptr;

        JS_REENTRANT(jsReentLock, TryGetArrayAndLength(args[0], scriptContext, _u("Array.prototype.slice"), &pArr, &obj, &length));

        if (length.IsSmallIndex())
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::SliceHelper(pArr, nullptr, obj, length.GetSmallIndex(), args, scriptContext));
        }

        Assert(pArr == nullptr || length.IsUint32Max());
        JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::SliceHelper(pArr, nullptr, obj, length.GetBigIndex(), args, scriptContext));
        JIT_HELPER_END(Array_Slice);
    }